

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

void __thiscall TPZMatrix<float>::Transpose(TPZMatrix<float> *this,TPZMatrix<float> *T)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long *plVar4;
  int64_t iVar5;
  int64_t iVar6;
  long *in_RSI;
  TPZBaseMatrix *in_RDI;
  int64_t c;
  int64_t r;
  undefined1 local_24 [4];
  long local_20;
  long local_18;
  long *local_10;
  
  local_10 = in_RSI;
  iVar5 = TPZBaseMatrix::Cols(in_RDI);
  iVar6 = TPZBaseMatrix::Rows(in_RDI);
  (**(code **)(*in_RSI + 0x68))(in_RSI,iVar5,iVar6);
  local_18 = 0;
  while( true ) {
    lVar1 = local_18;
    iVar5 = TPZBaseMatrix::Rows(in_RDI);
    if (iVar5 <= lVar1) break;
    local_20 = 0;
    while( true ) {
      lVar1 = local_20;
      iVar5 = TPZBaseMatrix::Cols(in_RDI);
      plVar4 = local_10;
      lVar3 = local_18;
      lVar2 = local_20;
      if (iVar5 <= lVar1) break;
      (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,local_18,local_20);
      (**(code **)(*plVar4 + 0x118))(plVar4,lVar2,lVar3,local_24);
      local_20 = local_20 + 1;
    }
    local_18 = local_18 + 1;
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::Transpose(TPZMatrix<TVar> *T) const {
	T->Resize( Cols(), Rows() );
	
	for ( int64_t r = 0; r < Rows(); r++ ) {
        for ( int64_t c = 0; c < Cols(); c++ ) {
            T->PutVal( c, r, GetVal( r, c ) );
        }
    }
}